

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O3

char * __thiscall
glcts::TextureBufferActiveUniformValidationVSFS::getFragmentShaderCode
          (TextureBufferActiveUniformValidationVSFS *this)

{
  return 
  "${VERSION}\n\n${TEXTURE_BUFFER_REQUIRE}\n\nprecision highp float;\n\nuniform highp samplerBuffer  sampler_buffer;\nuniform highp isamplerBuffer isampler_buffer;\nuniform highp usamplerBuffer usampler_buffer;\n\nlayout(location = 0) out vec4 outColor;\nvoid main(void)\n{\n    outColor =  texelFetch(sampler_buffer, 0);\n    outColor += vec4(texelFetch(isampler_buffer, 0));\n    outColor += vec4(texelFetch(usampler_buffer, 0));\n}\n"
  ;
}

Assistant:

const char* TextureBufferActiveUniformValidationVSFS::getFragmentShaderCode() const
{
	const char* result = "${VERSION}\n"
						 "\n"
						 "${TEXTURE_BUFFER_REQUIRE}\n"
						 "\n"
						 "precision highp float;\n"
						 "\n"
						 "uniform highp samplerBuffer  sampler_buffer;\n"
						 "uniform highp isamplerBuffer isampler_buffer;\n"
						 "uniform highp usamplerBuffer usampler_buffer;\n"
						 "\n"
						 "layout(location = 0) out vec4 outColor;\n"
						 "void main(void)\n"
						 "{\n"
						 "    outColor =  texelFetch(sampler_buffer, 0);\n"
						 "    outColor += vec4(texelFetch(isampler_buffer, 0));\n"
						 "    outColor += vec4(texelFetch(usampler_buffer, 0));\n"
						 "}\n";

	return result;
}